

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_struct_tests.cpp
# Opt level: O0

void __thiscall
graph_tests::PathFindingOnMap_ManualBFS_Test::PathFindingOnMap_ManualBFS_Test
          (PathFindingOnMap_ManualBFS_Test *this)

{
  PathFindingOnMap_ManualBFS_Test *this_local;
  
  PathFindingOnMap::PathFindingOnMap(&this->super_PathFindingOnMap);
  (this->super_PathFindingOnMap).super_TestWithParam<graph_tests::PathFindingOnMapCase>.super_Test.
  _vptr_Test = (_func_int **)&PTR__PathFindingOnMap_ManualBFS_Test_001f3800;
  (this->super_PathFindingOnMap).super_TestWithParam<graph_tests::PathFindingOnMapCase>.
  super_WithParamInterface<graph_tests::PathFindingOnMapCase>._vptr_WithParamInterface =
       (_func_int **)&DAT_001f3840;
  return;
}

Assistant:

TEST_P(PathFindingOnMap, ManualBFS) {
  const PointOnMap finish = GetFinish();
  std::queue<PointOnMap> q;
  q.push(finish);
  std::set<PointOnMap> visited;
  std::map<PointOnMap, BFSPathPoint> bfs_path;
  while (!q.empty()) {
    const PointOnMap u = q.front();
    q.pop();
    if (visited.find(u) != visited.end())
      continue;
    visited.insert(u);
    for (const PointOnMap& v : graph_.Neighbors(u)) {
      if (visited.find(v) == visited.end()) {
        q.push(v);
        if (u.i < v.i)
          bfs_path.emplace(v, BFSPathPoint(u, 'U'));
        else if (u.i > v.i)
          bfs_path.emplace(v, BFSPathPoint(u, 'D'));
        else if (u.j < v.j)
          bfs_path.emplace(v, BFSPathPoint(u, 'L'));
        else if (u.j > v.j)
          bfs_path.emplace(v, BFSPathPoint(u, 'R'));
      }
    }
  }
  const PointOnMap start = GetStart();
  if (visited.find(start) != visited.end()) {
    PointOnMap u = start;
    do {
      answer_.push_back(bfs_path.find(u)->second.type);
      u = bfs_path.find(u)->second.point;
    } while (u != finish);
  }
}